

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O1

void anon_unknown.dwarf_9c783b::noise_synth
               (ACMRandom *random,int lag,int n,int (*coords) [2],double *coeffs,double *data,int w,
               int h)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  double *__dest;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  pointer __src;
  double dVar7;
  vector<double,_std::allocator<double>_> padded;
  allocator_type local_8d;
  uint local_8c;
  undefined8 local_88;
  ulong local_80;
  ulong local_78;
  vector<double,_std::allocator<double>_> local_70;
  double *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_88 = CONCAT44(in_register_00000034,lag);
  uVar1 = lag * 3 + w;
  uVar2 = lag * 3 + h;
  uVar3 = (ulong)uVar2;
  local_8c = n;
  local_58 = data;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,(long)(int)(uVar2 * uVar1),&local_8d);
  local_80 = uVar3;
  if (0 < (int)uVar2) {
    local_40 = (ulong)uVar1;
    local_50 = local_40 * 8;
    lVar4 = 0;
    local_78 = 0;
    local_48 = uVar3;
    do {
      uVar3 = local_40;
      local_38 = lVar4;
      if (0 < (int)uVar1) {
        do {
          dVar7 = randn(random,1.0);
          *(double *)
           ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4) = dVar7;
          lVar4 = lVar4 + 8;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      local_78 = local_78 + 1;
      lVar4 = local_38 + local_50;
    } while (local_78 != local_48);
  }
  lVar4 = (long)(int)uVar1;
  if ((int)local_88 < (int)local_80) {
    lVar5 = (long)(int)local_88;
    do {
      if ((int)local_88 < (int)uVar1) {
        lVar6 = (long)(int)local_88;
        do {
          if ((int)local_8c < 1) {
            dVar7 = 0.0;
          }
          else {
            dVar7 = 0.0;
            uVar3 = 0;
            do {
              dVar7 = dVar7 + local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(int)(coords[uVar3][0] + (int)lVar6 +
                                    (coords[uVar3][1] + (int)lVar5) * uVar1)] * coeffs[uVar3];
              uVar3 = uVar3 + 1;
            } while (local_8c != uVar3);
          }
          local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 * lVar4 + lVar6] =
               dVar7 + local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar5 * lVar4 + lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar4);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != (int)local_80);
  }
  if (0 < h) {
    uVar3 = (ulong)(uint)h;
    __dest = local_58;
    __src = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      memcpy(__dest,__src,(ulong)(uint)w << 3);
      __src = __src + lVar4;
      __dest = __dest + w;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void noise_synth(libaom_test::ACMRandom *random, int lag, int n,
                 const int (*coords)[2], const double *coeffs, double *data,
                 int w, int h) {
  const int pad_size = 3 * lag;
  const int padded_w = w + pad_size;
  const int padded_h = h + pad_size;
  int x = 0, y = 0;
  std::vector<double> padded(padded_w * padded_h);

  for (y = 0; y < padded_h; ++y) {
    for (x = 0; x < padded_w; ++x) {
      padded[y * padded_w + x] = randn(random, 1.0);
    }
  }
  for (y = lag; y < padded_h; ++y) {
    for (x = lag; x < padded_w; ++x) {
      double sum = 0;
      int i = 0;
      for (i = 0; i < n; ++i) {
        const int dx = coords[i][0];
        const int dy = coords[i][1];
        sum += padded[(y + dy) * padded_w + (x + dx)] * coeffs[i];
      }
      padded[y * padded_w + x] += sum;
    }
  }
  // Copy over the padded rows to the output
  for (y = 0; y < h; ++y) {
    memcpy(data + y * w, &padded[0] + y * padded_w, sizeof(*data) * w);
  }
}